

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers-inl.h
# Opt level: O0

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* spdlog::cfg::helpers::extract_kv_(char sep,string *str)

{
  string *__y;
  string *in_RDX;
  char in_SIL;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDI;
  string v;
  string k;
  size_type n;
  string *in_stack_ffffffffffffff38;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *str_00;
  string local_b0 [32];
  string local_90 [48];
  string local_60 [32];
  string local_40 [32];
  long local_20;
  string *local_18;
  
  str_00 = in_RDI;
  local_18 = in_RDX;
  local_20 = ::std::__cxx11::string::find((char)in_RDX,(ulong)(uint)(int)in_SIL);
  ::std::__cxx11::string::string(local_40);
  ::std::__cxx11::string::string(local_60);
  if (local_20 == -1) {
    ::std::__cxx11::string::operator=(local_60,local_18);
  }
  else {
    ::std::__cxx11::string::substr((ulong)local_90,(ulong)local_18);
    in_stack_ffffffffffffff38 = local_90;
    ::std::__cxx11::string::operator=(local_40,in_stack_ffffffffffffff38);
    ::std::__cxx11::string::~string(in_stack_ffffffffffffff38);
    ::std::__cxx11::string::substr((ulong)local_b0,(ulong)local_18);
    ::std::__cxx11::string::operator=(local_60,local_b0);
    ::std::__cxx11::string::~string(local_b0);
  }
  __y = trim_(&str_00->first);
  trim_(&str_00->first);
  ::std::make_pair<std::__cxx11::string&,std::__cxx11::string&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffff38,__y);
  ::std::__cxx11::string::~string(local_60);
  ::std::__cxx11::string::~string(local_40);
  return in_RDI;
}

Assistant:

inline std::pair<std::string, std::string> extract_kv_(char sep, const std::string &str) {
    auto n = str.find(sep);
    std::string k, v;
    if (n == std::string::npos) {
        v = str;
    } else {
        k = str.substr(0, n);
        v = str.substr(n + 1);
    }
    return std::make_pair(trim_(k), trim_(v));
}